

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O1

void mat_vec(csc *A,c_float *x,c_float *y,c_int plus_eq)

{
  long lVar1;
  c_int *pcVar2;
  long lVar3;
  c_int *pcVar4;
  c_float *pcVar5;
  long lVar6;
  long lVar7;
  
  if ((plus_eq == 0) && (0 < A->m)) {
    memset(y,0,A->m << 3);
  }
  lVar1 = A->n;
  pcVar2 = A->p;
  if (pcVar2[lVar1] != 0) {
    if (plus_eq == -1) {
      if (0 < lVar1) {
        lVar6 = 0;
        do {
          lVar7 = pcVar2[lVar6];
          lVar3 = pcVar2[lVar6 + 1];
          if (lVar7 < lVar3) {
            pcVar4 = A->i;
            pcVar5 = A->x;
            do {
              y[pcVar4[lVar7]] = y[pcVar4[lVar7]] - pcVar5[lVar7] * x[lVar6];
              lVar7 = lVar7 + 1;
            } while (lVar3 != lVar7);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar1);
      }
    }
    else if (0 < lVar1) {
      lVar6 = 0;
      do {
        lVar7 = pcVar2[lVar6];
        lVar3 = pcVar2[lVar6 + 1];
        if (lVar7 < lVar3) {
          pcVar4 = A->i;
          pcVar5 = A->x;
          do {
            y[pcVar4[lVar7]] = pcVar5[lVar7] * x[lVar6] + y[pcVar4[lVar7]];
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar1);
    }
  }
  return;
}

Assistant:

void mat_vec(const csc *A, const c_float *x, c_float *y, c_int plus_eq) {
  c_int i, j;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->m; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] -= A->x[i] * x[j];
      }
    }
  } else {
    // y +=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] += A->x[i] * x[j];
      }
    }
  }
}